

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageFieldGenerator::GenerateBuilderMembers
          (MessageFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  
  pmVar1 = &this->variables_;
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  if (*(int *)(*(long *)(*(long *)(*(long *)(this->descriptor_ + 0x38) + 0x10) + 0x88) + 0x50) != 3)
  {
    google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  }
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public $type$ get$capitalized_name$()","return $name$_;\n",
             "return $name$Builder_.getMessage();\n",(char *)0x0);
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public Builder set$capitalized_name$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$name$_ = value;\n$on_changed$\n"
             ,"$name$Builder_.setMessage(value);\n","$set_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,
             "$deprecation$public Builder set$capitalized_name$(\n    $type$.Builder builderForValue)"
             ,"$name$_ = builderForValue.build();\n$on_changed$\n",
             "$name$Builder_.setMessage(builderForValue.build());\n",
             "$set_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public Builder merge$capitalized_name$($type$ value)",
             "if ($get_has_field_bit_builder$ &&\n    $name$_ != $type$.getDefaultInstance()) {\n  $name$_ =\n    $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n} else {\n  $name$_ = value;\n}\n$on_changed$\n"
             ,"$name$Builder_.mergeFrom(value);\n","$set_has_field_bit_builder$;\nreturn this;\n");
  WriteFieldDocComment(printer,this->descriptor_);
  PrintNestedBuilderFunction
            (this,printer,"$deprecation$public Builder clear$capitalized_name$()",
             "$name$_ = $type$.getDefaultInstance();\n$on_changed$\n","$name$Builder_.clear();\n",
             "$clear_has_field_bit_builder$;\nreturn this;\n");
  if (*(int *)(*(long *)(*(long *)(*(long *)(this->descriptor_ + 0x38) + 0x10) + 0x88) + 0x50) == 3)
  {
    return;
  }
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  WriteFieldDocComment(printer,this->descriptor_);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.

  printer->Print(variables_,
    // Used when the builder is null.
    "private $type$ $name$_ = $type$.getDefaultInstance();\n");

  if (HasNestedBuilders(descriptor_->containing_type())) {
    printer->Print(variables_,
      // If this builder is non-null, it is used and the other fields are
      // ignored.
      "private com.google.protobuf.SingleFieldBuilder<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
      "\n");
  }

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public boolean has$capitalized_name$() {\n"
    "  return $get_has_field_bit_builder$;\n"
    "}\n");

  // Field getField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public $type$ get$capitalized_name$()",

    "return $name$_;\n",

    "return $name$Builder_.getMessage();\n",

    NULL);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$($type$ value)",

    "if (value == null) {\n"
    "  throw new NullPointerException();\n"
    "}\n"
    "$name$_ = value;\n"
    "$on_changed$\n",

    "$name$Builder_.setMessage(value);\n",

    "$set_has_field_bit_builder$;\n"
    "return this;\n");

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    $type$.Builder builderForValue)",

    "$name$_ = builderForValue.build();\n"
    "$on_changed$\n",

    "$name$Builder_.setMessage(builderForValue.build());\n",

    "$set_has_field_bit_builder$;\n"
    "return this;\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder merge$capitalized_name$($type$ value)",

    "if ($get_has_field_bit_builder$ &&\n"
    "    $name$_ != $type$.getDefaultInstance()) {\n"
    "  $name$_ =\n"
    "    $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n"
    "} else {\n"
    "  $name$_ = value;\n"
    "}\n"
    "$on_changed$\n",

    "$name$Builder_.mergeFrom(value);\n",

    "$set_has_field_bit_builder$;\n"
    "return this;\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  PrintNestedBuilderFunction(printer,
    "$deprecation$public Builder clear$capitalized_name$()",

    "$name$_ = $type$.getDefaultInstance();\n"
    "$on_changed$\n",

    "$name$Builder_.clear();\n",

    "$clear_has_field_bit_builder$;\n"
    "return this;\n");

  if (HasNestedBuilders(descriptor_->containing_type())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public $type$.Builder get$capitalized_name$Builder() {\n"
      "  $set_has_field_bit_builder$;\n"
      "  $on_changed$\n"
      "  return get$capitalized_name$FieldBuilder().getBuilder();\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder() {\n"
      "  if ($name$Builder_ != null) {\n"
      "    return $name$Builder_.getMessageOrBuilder();\n"
      "  } else {\n"
      "    return $name$_;\n"
      "  }\n"
      "}\n");
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private com.google.protobuf.SingleFieldBuilder<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> \n"
      "    get$capitalized_name$FieldBuilder() {\n"
      "  if ($name$Builder_ == null) {\n"
      "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n"
      "        $type$, $type$.Builder, $type$OrBuilder>(\n"
      "            $name$_,\n"
      "            getParentForChildren(),\n"
      "            isClean());\n"
      "    $name$_ = null;\n"
      "  }\n"
      "  return $name$Builder_;\n"
      "}\n");
  }
}